

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O2

string * __thiscall
KV::KeyValues::getKeyValue
          (string *__return_storage_ptr__,KeyValues *this,string *keyName,size_t index,
          string *defaultVal)

{
  size_type sVar1;
  difference_type __d;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
  pVar2;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>
  it;
  _Base_ptr local_30;
  
  sVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>,_KV::KeyValues::kvCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
          ::count(&(this->keyvalues)._M_t,keyName);
  if (index < sVar1) {
    pVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>,_KV::KeyValues::kvCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
            ::equal_range(&(this->keyvalues)._M_t,keyName);
    local_30 = (_Base_ptr)pVar2.first._M_node;
    std::
    __advance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>,long>
              (&local_30,index,pVar2.second._M_node._M_node);
    std::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
              (__return_storage_ptr__,
               (optional<std::__cxx11::string> *)(*(long *)(local_30 + 2) + 8),defaultVal);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)defaultVal);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string KeyValues::getKeyValue( const std::string &keyName, size_t index, const std::string &defaultVal /*= ""*/ ) const
	{
		const size_t count = keyvalues.count( keyName );

		if ( index >= count )
			return defaultVal;

		auto range = keyvalues.equal_range( keyName );
		auto it = range.first;
		std::advance( it, index );

		return it->second->getValue( defaultVal );
	}